

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::validateSurfaceFormats
               (ResultCollector *results,Type wsiType,
               vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *formats)

{
  ResultCollector *this;
  bool bVar1;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  __normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  local_50;
  __normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  local_48;
  VkSurfaceFormatKHR *local_40;
  VkSurfaceFormatKHR *requiredFormat;
  size_t ndx;
  size_t numRequiredFormats;
  VkSurfaceFormatKHR *requiredFormats;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *formats_local;
  ResultCollector *pRStack_10;
  Type wsiType_local;
  ResultCollector *results_local;
  
  numRequiredFormats = 0;
  ndx = 0;
  if (wsiType == TYPE_ANDROID) {
    numRequiredFormats = (size_t)validateSurfaceFormats::s_androidFormats;
    ndx = 3;
  }
  requiredFormats = (VkSurfaceFormatKHR *)formats;
  formats_local._4_4_ = wsiType;
  pRStack_10 = results;
  for (requiredFormat = (VkSurfaceFormatKHR *)0x0; requiredFormat < ndx;
      requiredFormat = (VkSurfaceFormatKHR *)((long)&requiredFormat->format + 1)) {
    local_40 = (VkSurfaceFormatKHR *)(numRequiredFormats + (long)requiredFormat * 8);
    local_48._M_current =
         (VkSurfaceFormatKHR *)
         std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::begin
                   (requiredFormats);
    local_50._M_current =
         (VkSurfaceFormatKHR *)
         std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::end
                   (requiredFormats);
    bVar1 = de::
            contains<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR_const*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>,vk::VkSurfaceFormatKHR>
                      (&local_48,&local_50,local_40);
    this = pRStack_10;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      de::toString<vk::VkSurfaceFormatKHR>(&local_90,local_40);
      std::operator+(&local_70,&local_90," not supported");
      tcu::ResultCollector::fail(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return;
}

Assistant:

void validateSurfaceFormats (tcu::ResultCollector& results, Type wsiType, const vector<VkSurfaceFormatKHR>& formats)
{
	const VkSurfaceFormatKHR*	requiredFormats		= DE_NULL;
	size_t						numRequiredFormats	= 0;

	if (wsiType == TYPE_ANDROID)
	{
		static const VkSurfaceFormatKHR s_androidFormats[] =
		{
			{ VK_FORMAT_R8G8B8A8_UNORM,			VK_COLOR_SPACE_SRGB_NONLINEAR_KHR	},
			{ VK_FORMAT_R8G8B8A8_SRGB,			VK_COLOR_SPACE_SRGB_NONLINEAR_KHR	},
			{ VK_FORMAT_R5G6B5_UNORM_PACK16,	VK_COLOR_SPACE_SRGB_NONLINEAR_KHR	}
		};

		requiredFormats		= &s_androidFormats[0];
		numRequiredFormats	= DE_LENGTH_OF_ARRAY(s_androidFormats);
	}

	for (size_t ndx = 0; ndx < numRequiredFormats; ++ndx)
	{
		const VkSurfaceFormatKHR&	requiredFormat	= requiredFormats[ndx];

		if (!de::contains(formats.begin(), formats.end(), requiredFormat))
			results.fail(de::toString(requiredFormat) + " not supported");
	}
}